

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism>::GetReferenceIndexVec
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism> *this,
          TPZManVector<TPZCompMesh_*,_10> *cmeshVec,
          set<long,_std::less<long>,_std::allocator<long>_> *refIndexVec)

{
  int64_t iVar1;
  TPZCompMesh **ppTVar2;
  int64_t iVar3;
  TPZCompEl **ppTVar4;
  TPZGeoEl *this_00;
  TPZGeoEl *in_RDX;
  TPZVec<TPZCompMesh_*> *in_RSI;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar5;
  int64_t nel;
  TPZGeoElSide *geoside;
  int ns;
  TPZGeoEl *geoel;
  TPZCompEl *cel;
  int64_t j;
  int64_t i;
  TPZStack<TPZCompElSide,_10> sidevec;
  int64_t ncel;
  int64_t ncm;
  int64_t isub;
  TPZGeoMesh *gmesh;
  TPZCompMesh *cmesh;
  _Rb_tree_const_iterator<long> in_stack_fffffffffffffe30;
  TPZGeoEl *in_stack_fffffffffffffe38;
  TPZCompMesh *in_stack_fffffffffffffe40;
  value_type_conflict5 *in_stack_fffffffffffffe48;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_fffffffffffffe50;
  _Rb_tree_const_iterator<long> in_stack_fffffffffffffea0;
  long local_120;
  long local_108;
  TPZVec<TPZCompElSide> local_100 [5];
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  TPZStack<TPZCompElSide,_10> *in_stack_ffffffffffffffa8;
  TPZGeoElSide *in_stack_ffffffffffffffb0;
  long local_30;
  
  iVar1 = TPZVec<TPZCompMesh_*>::NElements(in_RSI);
  if (iVar1 != 0) {
    ppTVar2 = TPZVec<TPZCompMesh_*>::operator[](in_RSI,0);
    TPZCompMesh::Reference(*ppTVar2);
    TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_fffffffffffffe40);
    iVar1 = TPZVec<TPZCompMesh_*>::NElements(in_RSI);
    for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
      TPZVec<TPZCompMesh_*>::operator[](in_RSI,local_30);
      TPZCompMesh::LoadReferences(in_stack_fffffffffffffe40);
    }
    TPZStack<TPZCompElSide,_10>::TPZStack((TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffe40);
    for (local_108 = 0; local_108 < iVar1; local_108 = local_108 + 1) {
      TPZVec<TPZCompMesh_*>::operator[](in_RSI,local_108);
      iVar3 = TPZCompMesh::NElements((TPZCompMesh *)0x1b77da1);
      for (local_120 = 0; local_120 < iVar3; local_120 = local_120 + 1) {
        ppTVar2 = TPZVec<TPZCompMesh_*>::operator[](in_RSI,local_108);
        TPZCompMesh::ElementVec(*ppTVar2);
        ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            (in_stack_fffffffffffffe50,(int64_t)in_stack_fffffffffffffe48);
        if (*ppTVar4 != (TPZCompEl *)0x0) {
          this_00 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffe38);
          (**(code **)(*(long *)this_00 + 0xf0))();
          in_stack_fffffffffffffe50 = (TPZChunkVector<TPZCompEl_*,_10> *)operator_new(0x18);
          TPZGeoElSide::TPZGeoElSide
                    ((TPZGeoElSide *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                     (int)((ulong)in_stack_fffffffffffffe30._M_node >> 0x20));
          TPZManVector<TPZCompElSide,_10>::Resize
                    ((TPZManVector<TPZCompElSide,_10> *)in_stack_fffffffffffffea0._M_node,
                     (int64_t)in_RSI);
          TPZGeoElSide::HigherLevelCompElementList2
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                     in_stack_ffffffffffffffa0);
          in_stack_fffffffffffffe48 =
               (value_type_conflict5 *)TPZVec<TPZCompElSide>::NElements(local_100);
          if (in_stack_fffffffffffffe48 == (value_type_conflict5 *)0x0) {
            in_stack_fffffffffffffe38 = in_RDX;
            in_stack_fffffffffffffe40 = (TPZCompMesh *)TPZGeoEl::Index(this_00);
            pVar5 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                              ((set<long,_std::less<long>,_std::allocator<long>_> *)
                               in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
            in_stack_fffffffffffffe30 = pVar5.first._M_node;
            in_stack_fffffffffffffea0._M_node = in_stack_fffffffffffffe30._M_node;
          }
        }
      }
    }
    TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x1b78000);
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::GetReferenceIndexVec(TPZManVector<TPZCompMesh *> cmeshVec, std::set<int64_t> &refIndexVec){
    
    if(cmeshVec.NElements() == 0) return;
    TPZCompMesh *cmesh = cmeshVec[0];
    TPZGeoMesh *gmesh = cmesh->Reference();
    gmesh->ResetReference();
    int64_t isub;
    int64_t ncm = cmeshVec.NElements();
    for (isub=0; isub<ncm; isub++) {
        cmeshVec[isub]->LoadReferences();
    }
    int64_t ncel;
    TPZStack<TPZCompElSide> sidevec;
    for(int64_t i = 0; i< ncm; i++){
        ncel = cmeshVec[i]->NElements();
        for (int64_t j=0; j<ncel; j++) {
            TPZCompEl * cel = cmeshVec[i]->ElementVec()[j];
            if(cel){
                TPZGeoEl *geoel = cel->Reference();
                
#ifdef PZDEBUG
                if (!geoel){
                    PZError << "Error at " << __PRETTY_FUNCTION__ << " Geometry element null!\n";
                    DebugStop();
                }
#endif
                
                int ns = geoel->NSides();
                TPZGeoElSide *geoside = new TPZGeoElSide(geoel,ns-1);
                sidevec.Resize(0);
                geoside->HigherLevelCompElementList2(sidevec, 1,1);
                int64_t nel = sidevec.NElements();
                if (nel==0){
                    //std::cout << "Incluindo elemento " << geoel->Index() << std::endl;
                    refIndexVec.insert(geoel->Index());
                }
            }
        }
    }
    
    
#ifdef PZ_LOG
    {
        std::stringstream sout;
        sout << "Number of elements : " << refIndexVec.size() << std::endl;
        sout <<"Reference index of elements : "<< std::endl;
        std::set<int64_t>::iterator it;
        for (it=refIndexVec.begin() ; it != refIndexVec.end(); it++ )
            sout << " " << *it;
        sout << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    
}